

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O3

PointType __thiscall jhu::thrax::PhrasalRule::terminalIndex<false>(PhrasalRule *this,PointType i)

{
  Span SVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined2 in_register_00000032;
  int iVar5;
  
  iVar5 = CONCAT22(in_register_00000032,i);
  SVar1 = (this->lhs).span.tgt;
  if ((iVar5 < (int)SVar1 >> 0x10) && (SVar1.start <= iVar5)) {
    iVar3 = iVar5 - (int)SVar1;
    lVar4 = 4;
    do {
      iVar2 = *(int *)((long)&(this->nts)._M_elems[0].span.src.start + lVar4);
      if ((short)iVar2 <= iVar5) {
        if (iVar5 < iVar2 >> 0x10) {
          return -1;
        }
        iVar3 = iVar3 + (iVar2 - (iVar2 >> 0x10));
      }
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 100);
    return (PointType)iVar3;
  }
  return -1;
}

Assistant:

Span get() const {
    if constexpr (SourceSide) {
      return src;
    } else {
      return tgt;
    }
  }